

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# src_zoh.c
# Opt level: O1

SRC_ERROR zoh_vari_process(SRC_STATE *state,SRC_DATA *data)

{
  double dVar1;
  int iVar2;
  uint uVar3;
  void *pvVar4;
  float *pfVar5;
  float *pfVar6;
  SRC_ERROR SVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  ulong uVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  
  lVar8 = data->input_frames;
  if (lVar8 < 1) {
    return SRC_ERR_NO_ERROR;
  }
  pvVar4 = state->private_data;
  if (pvVar4 == (void *)0x0) {
    return SRC_ERR_NO_PRIVATE;
  }
  if (*(char *)((long)pvVar4 + 4) == '\0') {
    iVar2 = state->channels;
    if (0 < (long)iVar2) {
      pfVar5 = data->data_in;
      lVar9 = *(long *)((long)pvVar4 + 0x28);
      lVar11 = 0;
      do {
        *(float *)(lVar9 + lVar11 * 4) = pfVar5[lVar11];
        lVar11 = lVar11 + 1;
      } while (iVar2 != lVar11);
    }
    *(undefined1 *)((long)pvVar4 + 4) = 1;
  }
  uVar3 = state->channels;
  lVar11 = (long)(int)uVar3;
  lVar8 = lVar8 * lVar11;
  *(long *)((long)pvVar4 + 8) = lVar8;
  lVar9 = data->output_frames * lVar11;
  *(long *)((long)pvVar4 + 0x18) = lVar9;
  *(undefined8 *)((long)pvVar4 + 0x20) = 0;
  *(undefined8 *)((long)pvVar4 + 0x10) = 0;
  dVar1 = state->last_ratio;
  SVar7 = SRC_ERR_BAD_INTERNAL_STATE;
  if ((0.00390625 <= dVar1) && (dVar1 <= 256.0)) {
    dVar14 = state->last_position;
    dVar16 = dVar1;
    if (dVar14 < 1.0) {
      lVar10 = *(long *)((long)pvVar4 + 0x20);
      do {
        if ((lVar9 <= lVar10) || ((double)lVar8 <= (double)(int)uVar3 * dVar14 + 0.0)) break;
        if ((0 < lVar9) && (1e-20 < ABS(dVar1 - data->src_ratio))) {
          dVar16 = ((data->src_ratio - dVar1) * (double)lVar10) / (double)lVar9 + dVar1;
        }
        if (0 < (int)uVar3) {
          lVar12 = *(long *)((long)pvVar4 + 0x28);
          pfVar5 = data->data_out;
          uVar13 = 0;
          do {
            pfVar5[lVar10 + uVar13] = *(float *)(lVar12 + uVar13 * 4);
            uVar13 = uVar13 + 1;
          } while (uVar3 != uVar13);
          lVar10 = lVar10 + uVar13;
          *(long *)((long)pvVar4 + 0x20) = lVar10;
        }
        dVar14 = dVar14 + 1.0 / dVar16;
      } while (dVar14 < 1.0);
    }
    dVar15 = dVar14 - (double)(int)ROUND(dVar14);
    dVar15 = (double)(~-(ulong)(dVar15 < 0.0) & (ulong)dVar15 |
                     (ulong)(dVar15 + 1.0) & -(ulong)(dVar15 < 0.0));
    lVar12 = (long)(int)((int)ROUND(dVar14 - dVar15) * uVar3);
    lVar10 = *(long *)((long)pvVar4 + 0x20);
    if (lVar10 < lVar9) {
      do {
        if ((double)lVar8 < (double)(int)uVar3 * dVar15 + (double)lVar12) break;
        if ((0 < lVar9) && (1e-20 < ABS(dVar1 - data->src_ratio))) {
          dVar16 = ((data->src_ratio - dVar1) * (double)lVar10) / (double)lVar9 + dVar1;
        }
        if (0 < (int)uVar3) {
          pfVar5 = data->data_in;
          pfVar6 = data->data_out;
          uVar13 = 0;
          do {
            pfVar6[lVar10 + uVar13] = pfVar5[(lVar12 - lVar11) + uVar13];
            uVar13 = uVar13 + 1;
          } while (uVar3 != uVar13);
          lVar10 = lVar10 + uVar13;
          *(long *)((long)pvVar4 + 0x20) = lVar10;
        }
        dVar14 = dVar15 + 1.0 / dVar16;
        dVar15 = dVar14 - (double)(int)ROUND(dVar14);
        dVar15 = (double)(~-(ulong)(dVar15 < 0.0) & (ulong)dVar15 |
                         (ulong)(dVar15 + 1.0) & -(ulong)(dVar15 < 0.0));
        lVar12 = lVar12 + (int)((int)ROUND(dVar14 - dVar15) * uVar3);
      } while (lVar10 < lVar9);
    }
    if (lVar12 - lVar8 != 0 && lVar8 <= lVar12) {
      dVar15 = dVar15 + (double)((lVar12 - lVar8) / lVar11);
      lVar12 = lVar8;
    }
    *(long *)((long)pvVar4 + 0x10) = lVar12;
    state->last_position = dVar15;
    if (0 < (int)uVar3 && 0 < lVar12) {
      pfVar5 = data->data_in;
      lVar8 = *(long *)((long)pvVar4 + 0x28);
      lVar9 = 0;
      do {
        *(float *)(lVar8 + lVar9 * 4) = pfVar5[(lVar12 - lVar11) + lVar9];
        lVar9 = lVar9 + 1;
      } while (lVar11 != lVar9);
    }
    state->last_ratio = dVar16;
    data->input_frames_used = lVar12 / lVar11;
    data->output_frames_gen = lVar10 / lVar11;
    SVar7 = SRC_ERR_NO_ERROR;
  }
  return SVar7;
}

Assistant:

static SRC_ERROR
zoh_vari_process (SRC_STATE *state, SRC_DATA *data)
{	ZOH_DATA 	*priv ;
	double		src_ratio, input_index, rem ;
	int			ch ;

	if (data->input_frames <= 0)
		return SRC_ERR_NO_ERROR ;

	if (state->private_data == NULL)
		return SRC_ERR_NO_PRIVATE ;

	priv = (ZOH_DATA*) state->private_data ;

	if (!priv->dirty)
	{	/* If we have just been reset, set the last_value data. */
		for (ch = 0 ; ch < state->channels ; ch++)
			priv->last_value [ch] = data->data_in [ch] ;
		priv->dirty = true ;
		} ;

	priv->in_count = data->input_frames * state->channels ;
	priv->out_count = data->output_frames * state->channels ;
	priv->in_used = priv->out_gen = 0 ;

	src_ratio = state->last_ratio ;

	if (is_bad_src_ratio (src_ratio))
		return SRC_ERR_BAD_INTERNAL_STATE ;

	input_index = state->last_position ;

	/* Calculate samples before first sample in input array. */
	while (input_index < 1.0 && priv->out_gen < priv->out_count)
	{
		if (priv->in_used + state->channels * input_index >= priv->in_count)
			break ;

		if (priv->out_count > 0 && fabs (state->last_ratio - data->src_ratio) > SRC_MIN_RATIO_DIFF)
			src_ratio = state->last_ratio + priv->out_gen * (data->src_ratio - state->last_ratio) / priv->out_count ;

		for (ch = 0 ; ch < state->channels ; ch++)
		{	data->data_out [priv->out_gen] = priv->last_value [ch] ;
			priv->out_gen ++ ;
			} ;

		/* Figure out the next index. */
		input_index += 1.0 / src_ratio ;
		} ;

	rem = fmod_one (input_index) ;
	priv->in_used += state->channels * psf_lrint (input_index - rem) ;
	input_index = rem ;

	/* Main processing loop. */
	while (priv->out_gen < priv->out_count && priv->in_used + state->channels * input_index <= priv->in_count)
	{
		if (priv->out_count > 0 && fabs (state->last_ratio - data->src_ratio) > SRC_MIN_RATIO_DIFF)
			src_ratio = state->last_ratio + priv->out_gen * (data->src_ratio - state->last_ratio) / priv->out_count ;

		for (ch = 0 ; ch < state->channels ; ch++)
		{	data->data_out [priv->out_gen] = data->data_in [priv->in_used - state->channels + ch] ;
			priv->out_gen ++ ;
			} ;

		/* Figure out the next index. */
		input_index += 1.0 / src_ratio ;
		rem = fmod_one (input_index) ;

		priv->in_used += state->channels * psf_lrint (input_index - rem) ;
		input_index = rem ;
		} ;

	if (priv->in_used > priv->in_count)
	{	input_index += (priv->in_used - priv->in_count) / state->channels ;
		priv->in_used = priv->in_count ;
		} ;

	state->last_position = input_index ;

	if (priv->in_used > 0)
		for (ch = 0 ; ch < state->channels ; ch++)
			priv->last_value [ch] = data->data_in [priv->in_used - state->channels + ch] ;

	/* Save current ratio rather then target ratio. */
	state->last_ratio = src_ratio ;

	data->input_frames_used = priv->in_used / state->channels ;
	data->output_frames_gen = priv->out_gen / state->channels ;

	return SRC_ERR_NO_ERROR ;
}